

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,DecimalFormatSymbols *symbolsToAdopt,UErrorCode *status)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatProperties *pDVar2;
  DecimalFormatSymbols *size;
  size_t size_00;
  
  size = symbolsToAdopt;
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__DecimalFormat_003a4e88;
  pDVar1 = (DecimalFormatFields *)UMemory::operator_new((UMemory *)0x8a8,(size_t)size);
  if (pDVar1 == (DecimalFormatFields *)0x0) {
    this->fields = (DecimalFormatFields *)0x0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  else {
    size_00 = 0;
    memset(pDVar1,0,0x8a8);
    icu_63::number::impl::DecimalFormatFields::DecimalFormatFields(pDVar1);
    this->fields = pDVar1;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pDVar2 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,size_00);
      if (pDVar2 != (DecimalFormatProperties *)0x0) {
        icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar2);
      }
      LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
                ((LocalPointer<icu_63::number::impl::DecimalFormatProperties> *)pDVar1,pDVar2,status
                );
      pDVar1 = this->fields;
      pDVar2 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,(size_t)pDVar2);
      if (pDVar2 != (DecimalFormatProperties *)0x0) {
        icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar2);
      }
      LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
                (&pDVar1->exportedProperties,pDVar2,status);
      pDVar1 = this->fields;
      if (symbolsToAdopt == (DecimalFormatSymbols *)0x0) {
        symbolsToAdopt =
             (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pDVar2);
        if (symbolsToAdopt != (DecimalFormatSymbols *)0x0) {
          DecimalFormatSymbols::DecimalFormatSymbols(symbolsToAdopt,status);
        }
      }
      LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInsteadAndCheckErrorCode
                (&pDVar1->symbols,symbolsToAdopt,status);
      return;
    }
  }
  if (symbolsToAdopt != (DecimalFormatSymbols *)0x0) {
    (*(symbolsToAdopt->super_UObject)._vptr_UObject[1])(symbolsToAdopt);
    return;
  }
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const DecimalFormatSymbols* symbolsToAdopt, UErrorCode& status) {
    LocalPointer<const DecimalFormatSymbols> adoptedSymbols(symbolsToAdopt);
    fields = new DecimalFormatFields();
    if (U_FAILURE(status)) {
        return;
    }
    if (fields == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fields->properties.adoptInsteadAndCheckErrorCode(new DecimalFormatProperties(), status);
    fields->exportedProperties.adoptInsteadAndCheckErrorCode(new DecimalFormatProperties(), status);
    if (adoptedSymbols.isNull()) {
        fields->symbols.adoptInsteadAndCheckErrorCode(new DecimalFormatSymbols(status), status);
    } else {
        fields->symbols.adoptInsteadAndCheckErrorCode(adoptedSymbols.orphan(), status);
    }
}